

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

Ray * GetScreenToWorldRayEx
                (Ray *__return_storage_ptr__,Vector2 position,Camera camera,int width,int height)

{
  double top;
  Matrix projection;
  Matrix projection_00;
  Matrix projection_01;
  Matrix projection_02;
  Matrix projection_03;
  Matrix projection_04;
  undefined1 auVar1 [40];
  Matrix projection_05;
  Matrix view;
  Matrix view_00;
  Matrix view_01;
  Matrix view_02;
  Matrix view_03;
  Matrix view_04;
  Matrix view_05;
  undefined8 in_XMM0_Qb;
  undefined1 auVar2 [16];
  float fVar3;
  double right;
  undefined1 auVar4 [16];
  float fVar5;
  Vector3 VVar6;
  Vector3 source_00;
  Vector3 source_01;
  Vector3 VVar7;
  Vector3 source_03;
  Vector3 source_04;
  Vector3 v;
  Matrix matView;
  Matrix result;
  float local_ec;
  Matrix local_c8;
  Matrix local_88;
  undefined8 local_48;
  undefined8 local_38;
  Vector3 source;
  Vector3 source_02;
  
  (__return_storage_ptr__->position).z = 0.0;
  (__return_storage_ptr__->position).x = 0.0;
  (__return_storage_ptr__->position).y = 0.0;
  auVar4._0_4_ = (float)width;
  auVar4._4_4_ = (float)height;
  auVar4._8_8_ = 0;
  auVar2._0_4_ = position.x + position.x;
  auVar2._4_4_ = position.y + position.y;
  fVar3 = (float)((ulong)in_XMM0_Qb >> 0x20);
  auVar2._8_4_ = (float)in_XMM0_Qb + (float)in_XMM0_Qb;
  auVar2._12_4_ = fVar3 + fVar3;
  auVar2 = divps(auVar2,auVar4);
  fVar3 = auVar2._0_4_ + -1.0;
  fVar5 = 1.0 - auVar2._4_4_;
  MatrixLookAt(&local_c8,camera.position,camera.target,camera.up);
  local_88.m9 = 0.0;
  local_88.m13 = 0.0;
  local_88.m2 = 0.0;
  local_88.m6 = 0.0;
  local_88.m14 = 0.0;
  local_88.m3 = 0.0;
  local_88.m7 = 0.0;
  local_88.m11 = 0.0;
  local_88.m4 = 0.0;
  local_88.m8 = 0.0;
  local_88.m12 = 0.0;
  local_88.m1 = 0.0;
  local_88.m0 = 1.0;
  local_88.m5 = 1.0;
  local_88.m10 = 1.0;
  local_88.m15 = 1.0;
  if (camera.projection == 1) {
    top = (double)camera.fovy * 0.5;
    right = ((double)width / (double)height) * top;
    MatrixOrtho(&local_88,-right,right,-top,top,0.01,1000.0);
    projection_01.m4 = local_88.m4;
    projection_01.m0 = local_88.m0;
    projection_01.m12 = local_88.m12;
    projection_01.m8 = local_88.m8;
    projection_01.m5 = local_88.m5;
    projection_01.m1 = local_88.m1;
    projection_01.m13 = local_88.m13;
    projection_01.m9 = local_88.m9;
    projection_01.m6 = local_88.m6;
    projection_01.m2 = local_88.m2;
    projection_01.m14 = local_88.m14;
    projection_01.m10 = local_88.m10;
    projection_01.m7 = local_88.m7;
    projection_01.m3 = local_88.m3;
    projection_01.m15 = local_88.m15;
    projection_01.m11 = local_88.m11;
    VVar7.y = fVar5;
    VVar7.x = fVar3;
    view_01.m8 = local_c8.m8;
    view_01.m12 = local_c8.m12;
    view_01.m0 = local_c8.m0;
    view_01.m4 = local_c8.m4;
    view_01.m1 = local_c8.m1;
    view_01.m5 = local_c8.m5;
    view_01.m9 = local_c8.m9;
    view_01.m13 = local_c8.m13;
    view_01.m2 = local_c8.m2;
    view_01.m6 = local_c8.m6;
    view_01.m10 = local_c8.m10;
    view_01.m14 = local_c8.m14;
    view_01.m3 = local_c8.m3;
    view_01.m7 = local_c8.m7;
    view_01.m11 = local_c8.m11;
    view_01.m15 = local_c8.m15;
    VVar7.z = 0.0;
    VVar6 = Vector3Unproject(VVar7,projection_01,view_01);
    local_ec = VVar6.z;
    local_48 = VVar6._0_8_;
    projection_02.m4 = local_88.m4;
    projection_02.m0 = local_88.m0;
    projection_02.m12 = local_88.m12;
    projection_02.m8 = local_88.m8;
    projection_02.m5 = local_88.m5;
    projection_02.m1 = local_88.m1;
    projection_02.m13 = local_88.m13;
    projection_02.m9 = local_88.m9;
    projection_02.m6 = local_88.m6;
    projection_02.m2 = local_88.m2;
    projection_02.m14 = local_88.m14;
    projection_02.m10 = local_88.m10;
    projection_02.m7 = local_88.m7;
    projection_02.m3 = local_88.m3;
    projection_02.m15 = local_88.m15;
    projection_02.m11 = local_88.m11;
    source_01.y = fVar5;
    source_01.x = fVar3;
    view_02.m8 = local_c8.m8;
    view_02.m12 = local_c8.m12;
    view_02.m0 = local_c8.m0;
    view_02.m4 = local_c8.m4;
    view_02.m1 = local_c8.m1;
    view_02.m5 = local_c8.m5;
    view_02.m9 = local_c8.m9;
    view_02.m13 = local_c8.m13;
    view_02.m2 = local_c8.m2;
    view_02.m6 = local_c8.m6;
    view_02.m10 = local_c8.m10;
    view_02.m14 = local_c8.m14;
    view_02.m3 = local_c8.m3;
    view_02.m7 = local_c8.m7;
    view_02.m11 = local_c8.m11;
    view_02.m15 = local_c8.m15;
    source_01.z = 1.0;
    VVar6 = Vector3Unproject(source_01,projection_02,view_02);
    local_38 = VVar6._0_8_;
    projection_03.m4 = local_88.m4;
    projection_03.m0 = local_88.m0;
    projection_03.m12 = local_88.m12;
    projection_03.m8 = local_88.m8;
    projection_03.m5 = local_88.m5;
    projection_03.m1 = local_88.m1;
    projection_03.m13 = local_88.m13;
    projection_03.m9 = local_88.m9;
    projection_03.m6 = local_88.m6;
    projection_03.m2 = local_88.m2;
    projection_03.m14 = local_88.m14;
    projection_03.m10 = local_88.m10;
    projection_03.m7 = local_88.m7;
    projection_03.m3 = local_88.m3;
    projection_03.m15 = local_88.m15;
    projection_03.m11 = local_88.m11;
    source_02.y = fVar5;
    source_02.x = fVar3;
    view_03.m8 = local_c8.m8;
    view_03.m12 = local_c8.m12;
    view_03.m0 = local_c8.m0;
    view_03.m4 = local_c8.m4;
    view_03.m1 = local_c8.m1;
    view_03.m5 = local_c8.m5;
    view_03.m9 = local_c8.m9;
    view_03.m13 = local_c8.m13;
    view_03.m2 = local_c8.m2;
    view_03.m6 = local_c8.m6;
    view_03.m10 = local_c8.m10;
    view_03.m14 = local_c8.m14;
    view_03.m3 = local_c8.m3;
    view_03.m7 = local_c8.m7;
    view_03.m11 = local_c8.m11;
    view_03.m15 = local_c8.m15;
    source_02.z = -1.0;
    VVar7 = Vector3Unproject(source_02,projection_03,view_03);
    __return_storage_ptr__->position = VVar7;
    VVar6.z = VVar6.z;
    VVar6.x = (float)(undefined4)local_38;
    VVar6.y = (float)local_38._4_4_;
  }
  else if (camera.projection == 0) {
    MatrixPerspective(&local_88,(double)(camera.fovy * 0.017453292),(double)width / (double)height,
                      rlCullDistanceNear,rlCullDistanceFar);
    projection.m4 = local_88.m4;
    projection.m0 = local_88.m0;
    projection.m12 = local_88.m12;
    projection.m8 = local_88.m8;
    projection.m5 = local_88.m5;
    projection.m1 = local_88.m1;
    projection.m13 = local_88.m13;
    projection.m9 = local_88.m9;
    projection.m6 = local_88.m6;
    projection.m2 = local_88.m2;
    projection.m14 = local_88.m14;
    projection.m10 = local_88.m10;
    projection.m7 = local_88.m7;
    projection.m3 = local_88.m3;
    projection.m15 = local_88.m15;
    projection.m11 = local_88.m11;
    source.y = fVar5;
    source.x = fVar3;
    view.m8 = local_c8.m8;
    view.m12 = local_c8.m12;
    view.m0 = local_c8.m0;
    view.m4 = local_c8.m4;
    view.m1 = local_c8.m1;
    view.m5 = local_c8.m5;
    view.m9 = local_c8.m9;
    view.m13 = local_c8.m13;
    view.m2 = local_c8.m2;
    view.m6 = local_c8.m6;
    view.m10 = local_c8.m10;
    view.m14 = local_c8.m14;
    view.m3 = local_c8.m3;
    view.m7 = local_c8.m7;
    view.m11 = local_c8.m11;
    view.m15 = local_c8.m15;
    source.z = 0.0;
    VVar6 = Vector3Unproject(source,projection,view);
    local_ec = VVar6.z;
    local_48 = VVar6._0_8_;
    projection_00.m4 = local_88.m4;
    projection_00.m0 = local_88.m0;
    projection_00.m12 = local_88.m12;
    projection_00.m8 = local_88.m8;
    projection_00.m5 = local_88.m5;
    projection_00.m1 = local_88.m1;
    projection_00.m13 = local_88.m13;
    projection_00.m9 = local_88.m9;
    projection_00.m6 = local_88.m6;
    projection_00.m2 = local_88.m2;
    projection_00.m14 = local_88.m14;
    projection_00.m10 = local_88.m10;
    projection_00.m7 = local_88.m7;
    projection_00.m3 = local_88.m3;
    projection_00.m15 = local_88.m15;
    projection_00.m11 = local_88.m11;
    source_00.y = fVar5;
    source_00.x = fVar3;
    view_00.m8 = local_c8.m8;
    view_00.m12 = local_c8.m12;
    view_00.m0 = local_c8.m0;
    view_00.m4 = local_c8.m4;
    view_00.m1 = local_c8.m1;
    view_00.m5 = local_c8.m5;
    view_00.m9 = local_c8.m9;
    view_00.m13 = local_c8.m13;
    view_00.m2 = local_c8.m2;
    view_00.m6 = local_c8.m6;
    view_00.m10 = local_c8.m10;
    view_00.m14 = local_c8.m14;
    view_00.m3 = local_c8.m3;
    view_00.m7 = local_c8.m7;
    view_00.m11 = local_c8.m11;
    view_00.m15 = local_c8.m15;
    source_00.z = 1.0;
    VVar6 = Vector3Unproject(source_00,projection_00,view_00);
    (__return_storage_ptr__->position).x = camera.position.x;
    (__return_storage_ptr__->position).y = camera.position.y;
    (__return_storage_ptr__->position).z = camera.position.z;
  }
  else {
    source_03.y = fVar5;
    source_03.x = fVar3;
    auVar1 = ZEXT2440(CONCAT816(0x3f80000000000000,ZEXT816(0x3f800000)));
    projection_04.m10 = 1.0;
    projection_04.m14 = 0.0;
    projection_04.m0 = (float)auVar1._0_4_;
    projection_04.m4 = (float)auVar1._4_4_;
    projection_04.m8 = (float)auVar1._8_4_;
    projection_04.m12 = (float)auVar1._12_4_;
    projection_04.m1 = (float)auVar1._16_4_;
    projection_04.m5 = (float)auVar1._20_4_;
    projection_04.m9 = (float)auVar1._24_4_;
    projection_04.m13 = (float)auVar1._28_4_;
    projection_04.m2 = (float)auVar1._32_4_;
    projection_04.m6 = (float)auVar1._36_4_;
    projection_04.m3 = 0.0;
    projection_04.m7 = 0.0;
    projection_04.m11 = 0.0;
    projection_04.m15 = 1.0;
    view_04.m8 = local_c8.m8;
    view_04.m12 = local_c8.m12;
    view_04.m0 = local_c8.m0;
    view_04.m4 = local_c8.m4;
    view_04.m1 = local_c8.m1;
    view_04.m5 = local_c8.m5;
    view_04.m9 = local_c8.m9;
    view_04.m13 = local_c8.m13;
    view_04.m2 = local_c8.m2;
    view_04.m6 = local_c8.m6;
    view_04.m10 = local_c8.m10;
    view_04.m14 = local_c8.m14;
    view_04.m3 = local_c8.m3;
    view_04.m7 = local_c8.m7;
    view_04.m11 = local_c8.m11;
    view_04.m15 = local_c8.m15;
    source_03.z = 0.0;
    VVar6 = Vector3Unproject(source_03,projection_04,view_04);
    local_ec = VVar6.z;
    local_48 = VVar6._0_8_;
    projection_05.m4 = local_88.m4;
    projection_05.m0 = local_88.m0;
    projection_05.m12 = local_88.m12;
    projection_05.m8 = local_88.m8;
    projection_05.m5 = local_88.m5;
    projection_05.m1 = local_88.m1;
    projection_05.m13 = local_88.m13;
    projection_05.m9 = local_88.m9;
    projection_05.m6 = local_88.m6;
    projection_05.m2 = local_88.m2;
    projection_05.m14 = local_88.m14;
    projection_05.m10 = local_88.m10;
    projection_05.m7 = local_88.m7;
    projection_05.m3 = local_88.m3;
    projection_05.m15 = local_88.m15;
    projection_05.m11 = local_88.m11;
    source_04.y = fVar5;
    source_04.x = fVar3;
    view_05.m8 = local_c8.m8;
    view_05.m12 = local_c8.m12;
    view_05.m0 = local_c8.m0;
    view_05.m4 = local_c8.m4;
    view_05.m1 = local_c8.m1;
    view_05.m5 = local_c8.m5;
    view_05.m9 = local_c8.m9;
    view_05.m13 = local_c8.m13;
    view_05.m2 = local_c8.m2;
    view_05.m6 = local_c8.m6;
    view_05.m10 = local_c8.m10;
    view_05.m14 = local_c8.m14;
    view_05.m3 = local_c8.m3;
    view_05.m7 = local_c8.m7;
    view_05.m11 = local_c8.m11;
    view_05.m15 = local_c8.m15;
    source_04.z = 1.0;
    VVar6 = Vector3Unproject(source_04,projection_05,view_05);
  }
  v.z = VVar6.z - local_ec;
  v.x = VVar6.x - (float)local_48;
  v.y = VVar6.y - local_48._4_4_;
  VVar6 = Vector3Normalize(v);
  __return_storage_ptr__->direction = VVar6;
  return __return_storage_ptr__;
}

Assistant:

Ray GetScreenToWorldRayEx(Vector2 position, Camera camera, int width, int height)
{
    Ray ray = { 0 };

    // Calculate normalized device coordinates
    // NOTE: y value is negative
    float x = (2.0f*position.x)/(float)width - 1.0f;
    float y = 1.0f - (2.0f*position.y)/(float)height;
    float z = 1.0f;

    // Store values in a vector
    Vector3 deviceCoords = { x, y, z };

    // Calculate view matrix from camera look at
    Matrix matView = MatrixLookAt(camera.position, camera.target, camera.up);

    Matrix matProj = MatrixIdentity();

    if (camera.projection == CAMERA_PERSPECTIVE)
    {
        // Calculate projection matrix from perspective
        matProj = MatrixPerspective(camera.fovy*DEG2RAD, ((double)width/(double)height), rlGetCullDistanceNear(), rlGetCullDistanceFar());
    }
    else if (camera.projection == CAMERA_ORTHOGRAPHIC)
    {
        double aspect = (double)width/(double)height;
        double top = camera.fovy/2.0;
        double right = top*aspect;

        // Calculate projection matrix from orthographic
        matProj = MatrixOrtho(-right, right, -top, top, 0.01, 1000.0);
    }

    // Unproject far/near points
    Vector3 nearPoint = Vector3Unproject((Vector3){ deviceCoords.x, deviceCoords.y, 0.0f }, matProj, matView);
    Vector3 farPoint = Vector3Unproject((Vector3){ deviceCoords.x, deviceCoords.y, 1.0f }, matProj, matView);

    // Unproject the mouse cursor in the near plane
    // We need this as the source position because orthographic projects,
    // compared to perspective doesn't have a convergence point,
    // meaning that the "eye" of the camera is more like a plane than a point
    Vector3 cameraPlanePointerPos = Vector3Unproject((Vector3){ deviceCoords.x, deviceCoords.y, -1.0f }, matProj, matView);

    // Calculate normalized direction vector
    Vector3 direction = Vector3Normalize(Vector3Subtract(farPoint, nearPoint));

    if (camera.projection == CAMERA_PERSPECTIVE) ray.position = camera.position;
    else if (camera.projection == CAMERA_ORTHOGRAPHIC) ray.position = cameraPlanePointerPos;

    // Apply calculated vectors to ray
    ray.direction = direction;

    return ray;
}